

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.h
# Opt level: O0

void __thiscall
VmBlock::VmBlock(VmBlock *this,Allocator *allocator,SynBase *source,InplaceStr name,uint uniqueId)

{
  uint uniqueId_local;
  SynBase *source_local;
  Allocator *allocator_local;
  VmBlock *this_local;
  InplaceStr name_local;
  
  VmValue::VmValue(&this->super_VmValue,3,allocator,VmType::Block,source);
  (this->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmBlock_002d2d18;
  (this->name).begin = name.begin;
  (this->name).end = name.end;
  this->uniqueId = uniqueId;
  SmallArray<VmBlock_*,_4U>::SmallArray(&this->predecessors,allocator);
  SmallArray<VmBlock_*,_4U>::SmallArray(&this->successors,allocator);
  SmallArray<VmBlock_*,_4U>::SmallArray(&this->dominanceFrontier,allocator);
  SmallArray<VmBlock_*,_4U>::SmallArray(&this->dominanceChildren,allocator);
  SmallArray<VmInstruction_*,_4U>::SmallArray(&this->liveIn,allocator);
  SmallArray<VmInstruction_*,_4U>::SmallArray(&this->liveOut,allocator);
  this->parent = (VmFunction *)0x0;
  this->prevSibling = (VmBlock *)0x0;
  this->nextSibling = (VmBlock *)0x0;
  this->firstInstruction = (VmInstruction *)0x0;
  this->lastInstruction = (VmInstruction *)0x0;
  this->insertPoint = (VmInstruction *)0x0;
  this->address = 0xffffffff;
  this->visited = false;
  this->controlGraphPreOrderId = 0xffffffff;
  this->controlGraphPostOrderId = 0xffffffff;
  this->dominanceGraphPreOrderId = 0xffffffff;
  this->dominanceGraphPostOrderId = 0xffffffff;
  this->idom = (VmBlock *)0x0;
  this->hasAssignmentForId = 0;
  this->hasPhiNodeForId = 0;
  this->entryPc = (VmInstruction *)0x0;
  this->exitPc = (VmInstruction *)0x0;
  return;
}

Assistant:

VmBlock(Allocator *allocator, SynBase *source, InplaceStr name, unsigned uniqueId): VmValue(myTypeID, allocator, VmType::Block, source), name(name), uniqueId(uniqueId), predecessors(allocator), successors(allocator), dominanceFrontier(allocator), dominanceChildren(allocator), liveIn(allocator), liveOut(allocator)
	{
		parent = NULL;

		prevSibling = NULL;
		nextSibling = NULL;

		firstInstruction = NULL;
		lastInstruction = NULL;

		insertPoint = NULL;

		address = ~0u;

		visited = false;

		controlGraphPreOrderId = ~0u;
		controlGraphPostOrderId = ~0u;

		dominanceGraphPreOrderId = ~0u;
		dominanceGraphPostOrderId = ~0u;

		idom = NULL;

		hasAssignmentForId = 0;
		hasPhiNodeForId = 0;

		entryPc = NULL;
		exitPc = NULL;
	}